

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint filter(uchar *out,uchar *in,uint w,uint h,LodePNGColorMode *color,
           LodePNGEncoderSettings *settings)

{
  size_t length;
  byte bVar1;
  uchar filterType;
  ulong uVar2;
  uint uVar3;
  void *pvVar4;
  uchar *puVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  ulong bytewidth;
  uchar *puVar17;
  uchar *puVar18;
  long lVar19;
  ulong uVar20;
  byte bVar21;
  bool bVar22;
  undefined8 *in_stack_00000008;
  uchar *dummy;
  size_t size [5];
  uchar *attempt_1 [5];
  uchar *attempt [5];
  uchar *local_4f0;
  uchar *local_4b0;
  ulong local_4a8;
  ulong local_4a0;
  ulong auStack_498 [6];
  long alStack_468 [6];
  LodePNGCompressSettings local_438 [21];
  
  uVar3 = getNumColorChannels((LodePNGColorType)color);
  uVar3 = uVar3 * (uint)settings;
  lVar7 = (ulong)(w >> 3) * (ulong)uVar3;
  uVar20 = (ulong)((w & 7) * uVar3 + 7 >> 3);
  length = lVar7 + uVar20;
  bytewidth = (ulong)(uVar3 + 7 >> 3);
  uVar9 = *(uint *)(in_stack_00000008 + 7);
  if ((*(int *)((long)in_stack_00000008 + 0x34) == 0) ||
     (7 < (uint)settings && (LodePNGColorType)color != LCT_PALETTE)) {
    if (uVar3 == 0) {
      return 0x1f;
    }
    if (4 < uVar9) {
      if (3 < uVar9 - 5) {
        return 0x58;
      }
      lVar7 = lVar7 + uVar20 + 1;
      switch(uVar9) {
      case 6:
        lVar12 = 0;
        uVar9 = 0;
        do {
          pvVar4 = malloc(length);
          auStack_498[lVar12] = (ulong)pvVar4;
          if (pvVar4 == (void *)0x0) {
            uVar9 = 0x53;
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 != 5);
        if (h != 0 && uVar9 == 0) {
          uVar16 = 0;
          local_4f0 = (uchar *)0x0;
          uVar11 = 0;
          uVar20 = 0;
          puVar17 = out;
          do {
            lVar12 = length * uVar16;
            uVar13 = 0;
            do {
              puVar18 = (uchar *)auStack_498[uVar13];
              filterScanline(puVar18,in + lVar12,local_4f0,length,bytewidth,(uchar)uVar13);
              memset(local_438,0,0x400);
              if (length != 0) {
                uVar6 = 0;
                do {
                  (&local_438[0].btype)[puVar18[uVar6]] = (&local_438[0].btype)[puVar18[uVar6]] + 1;
                  uVar6 = uVar6 + 1;
                } while (length != (uVar6 & 0xffffffff));
              }
              (&local_438[0].btype)[uVar13] = (&local_438[0].btype)[uVar13] + 1;
              lVar14 = 0;
              uVar6 = 0;
              do {
                uVar3 = (&local_438[0].btype)[lVar14];
                uVar10 = (ulong)uVar3;
                if (uVar10 == 0) {
                  lVar19 = 0;
                }
                else {
                  uVar8 = (ulong)(uVar3 >> 0x10);
                  if (0xffff >= uVar3) {
                    uVar8 = uVar10;
                  }
                  lVar15 = (ulong)(0xffff < uVar3) * 0x10;
                  lVar19 = lVar15 + 8;
                  uVar2 = uVar8 >> 8;
                  if (uVar8 < 0x100) {
                    lVar19 = lVar15;
                    uVar2 = uVar8;
                  }
                  lVar15 = lVar19 + 4;
                  uVar8 = uVar2 >> 4;
                  if (uVar2 < 0x10) {
                    lVar15 = lVar19;
                    uVar8 = uVar2;
                  }
                  uVar3 = (uint)(uVar8 >> 2);
                  lVar19 = lVar15 + 2;
                  if (uVar8 < 4) {
                    uVar3 = (uint)uVar8;
                    lVar19 = lVar15;
                  }
                  lVar19 = (lVar19 + 1) - (ulong)(uVar3 < 2);
                  lVar19 = lVar19 * uVar10 + ((-1L << ((byte)lVar19 & 0x3f)) + uVar10) * 2;
                }
                uVar6 = uVar6 + lVar19;
                lVar14 = lVar14 + 1;
              } while (lVar14 != 0x100);
              if (uVar20 < uVar6 || uVar13 == 0) {
                uVar11 = uVar13 & 0xffffffff;
                uVar20 = uVar6;
              }
              uVar13 = uVar13 + 1;
            } while (uVar13 != 5);
            out[lVar7 * uVar16] = (uchar)uVar11;
            if (length != 0) {
              uVar13 = auStack_498[uVar11];
              uVar6 = 1;
              do {
                puVar17[uVar6] = *(uchar *)((uVar13 - 1) + uVar6);
                uVar10 = uVar6 & 0xffffffff;
                uVar6 = uVar6 + 1;
              } while (length != uVar10);
            }
            uVar16 = uVar16 + 1;
            puVar17 = puVar17 + lVar7;
            local_4f0 = in + lVar12;
          } while (uVar16 != h);
        }
        lVar7 = 0;
        do {
          free((void *)auStack_498[lVar7]);
          lVar7 = lVar7 + 1;
        } while (lVar7 != 5);
        return uVar9;
      case 7:
        local_438[0]._8_8_ = in_stack_00000008[1];
        local_438[0]._16_8_ = in_stack_00000008[2];
        local_438[0].custom_context = (void *)in_stack_00000008[5];
        local_438[0].use_lz77 = (uint)((ulong)*in_stack_00000008 >> 0x20);
        local_438[0].btype = 1;
        local_438[0].custom_zlib =
             (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0
        ;
        local_438[0].custom_deflate =
             (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0
        ;
        lVar12 = 0;
        uVar9 = 0;
        do {
          pvVar4 = malloc(length);
          alStack_468[lVar12] = (long)pvVar4;
          if (pvVar4 == (void *)0x0) {
            uVar9 = 0x53;
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 != 5);
        if (h != 0 && uVar9 == 0) {
          local_4a8 = (ulong)h;
          uVar11 = 0;
          uVar3 = 0;
          uVar20 = 0;
          puVar17 = (uchar *)0x0;
          puVar18 = out;
          do {
            lVar14 = length * uVar11;
            lVar19 = 0;
            lVar12 = 0;
            local_4a0 = uVar11;
            do {
              puVar5 = (uchar *)alStack_468[lVar12];
              filterScanline(puVar5,in + lVar14,puVar17,length,bytewidth,(uchar)lVar12);
              auStack_498[lVar12] = 0;
              local_4b0 = (uchar *)0x0;
              zlib_compress(&local_4b0,(size_t *)((long)auStack_498 + lVar19),puVar5,
                            length & 0xffffffff,local_438);
              free(local_4b0);
              uVar11 = auStack_498[lVar12];
              bVar22 = uVar11 < uVar20;
              if (bVar22 || lVar12 == 0) {
                uVar20 = uVar11;
              }
              if (bVar22 || lVar12 == 0) {
                uVar3 = (uint)lVar12;
              }
              lVar12 = lVar12 + 1;
              lVar19 = lVar19 + 8;
            } while (lVar12 != 5);
            out[lVar7 * local_4a0] = (uchar)uVar3;
            if (length != 0) {
              lVar12 = alStack_468[uVar3];
              uVar11 = 1;
              do {
                puVar18[uVar11] = *(uchar *)(lVar12 + -1 + uVar11);
                uVar16 = uVar11 & 0xffffffff;
                uVar11 = uVar11 + 1;
              } while (length != uVar16);
            }
            uVar11 = local_4a0 + 1;
            puVar18 = puVar18 + lVar7;
            puVar17 = in + lVar14;
          } while (uVar11 != local_4a8);
        }
        lVar7 = 0;
        do {
          free((void *)alStack_468[lVar7]);
          lVar7 = lVar7 + 1;
        } while (lVar7 != 5);
        return uVar9;
      case 8:
        if (h == 0) {
          return 0;
        }
        puVar18 = out + 1;
        uVar20 = 0;
        puVar17 = (uchar *)0x0;
        do {
          puVar5 = in;
          filterType = *(uchar *)(in_stack_00000008[8] + uVar20);
          puVar18[-1] = filterType;
          filterScanline(puVar18,puVar5,puVar17,length,bytewidth,filterType);
          uVar20 = uVar20 + 1;
          puVar18 = puVar18 + lVar7;
          in = puVar5 + length;
          puVar17 = puVar5;
        } while (h != uVar20);
        return 0;
      }
      lVar12 = 0;
      uVar9 = 0;
      do {
        pvVar4 = malloc(length);
        *(void **)(&local_438[0].btype + lVar12 * 2) = pvVar4;
        if (pvVar4 == (void *)0x0) {
          uVar9 = 0x53;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != 5);
      if (h != 0 && uVar9 == 0) {
        uVar11 = 0;
        local_4f0 = (uchar *)0x0;
        bVar21 = 0;
        uVar20 = 0;
        puVar17 = out;
        do {
          lVar12 = length * uVar11;
          lVar14 = 0;
          do {
            puVar18 = *(uchar **)(&local_438[0].btype + lVar14 * 2);
            filterScanline(puVar18,in + lVar12,local_4f0,length,bytewidth,(byte)lVar14);
            if (lVar14 == 0) {
              if (length == 0) goto LAB_00160b8a;
              uVar13 = 0;
              uVar16 = 0;
              do {
                uVar16 = uVar16 + puVar18[uVar13];
                uVar13 = uVar13 + 1;
              } while (length != (uVar13 & 0xffffffff));
            }
            else if (length == 0) {
LAB_00160b8a:
              uVar16 = 0;
            }
            else {
              uVar13 = 0;
              uVar16 = 0;
              do {
                bVar1 = puVar18[uVar13];
                uVar3 = bVar1 ^ 0xff;
                if (-1 < (char)bVar1) {
                  uVar3 = (uint)bVar1;
                }
                uVar16 = uVar16 + uVar3;
                uVar13 = uVar13 + 1;
              } while (length != (uVar13 & 0xffffffff));
            }
            if (uVar16 < uVar20 || lVar14 == 0) {
              bVar21 = (byte)lVar14;
              uVar20 = uVar16;
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 != 5);
          out[lVar7 * uVar11] = bVar21;
          if (length != 0) {
            lVar14 = *(long *)(&local_438[0].btype + (ulong)bVar21 * 2);
            uVar16 = 1;
            do {
              puVar17[uVar16] = *(uchar *)(lVar14 + -1 + uVar16);
              uVar13 = uVar16 & 0xffffffff;
              uVar16 = uVar16 + 1;
            } while (length != uVar13);
          }
          uVar11 = uVar11 + 1;
          puVar17 = puVar17 + lVar7;
          local_4f0 = in + lVar12;
        } while (uVar11 != h);
      }
      lVar7 = 0;
      do {
        free(*(void **)(&local_438[0].btype + lVar7 * 2));
        lVar7 = lVar7 + 1;
      } while (lVar7 != 5);
      return uVar9;
    }
  }
  else {
    uVar9 = 0;
    if (uVar3 == 0) {
      return 0x1f;
    }
  }
  if (h != 0) {
    uVar11 = (ulong)h;
    puVar18 = out + 1;
    puVar17 = (uchar *)0x0;
    do {
      puVar5 = in;
      puVar18[-1] = (uchar)uVar9;
      filterScanline(puVar18,puVar5,puVar17,length,bytewidth,(uchar)uVar9);
      puVar18 = puVar18 + uVar20 + lVar7 + 1;
      uVar11 = uVar11 - 1;
      in = puVar5 + length;
      puVar17 = puVar5;
    } while (uVar11 != 0);
  }
  return 0;
}

Assistant:

static unsigned filter(unsigned char* out, const unsigned char* in, unsigned w, unsigned h,
                       const LodePNGColorMode* color, const LodePNGEncoderSettings* settings) {
  /*
  For PNG filter method 0
  out must be a buffer with as size: h + (w * h * bpp + 7u) / 8u, because there are
  the scanlines with 1 extra byte per scanline
  */

  unsigned bpp = lodepng_get_bpp(color);
  /*the width of a scanline in bytes, not including the filter type*/
  size_t linebytes = lodepng_get_raw_size_idat(w, 1, bpp) - 1u;

  /*bytewidth is used for filtering, is 1 when bpp < 8, number of bytes per pixel otherwise*/
  size_t bytewidth = (bpp + 7u) / 8u;
  const unsigned char* prevline = 0;
  unsigned x, y;
  unsigned error = 0;
  LodePNGFilterStrategy strategy = settings->filter_strategy;

  if(settings->filter_palette_zero && (color->colortype == LCT_PALETTE || color->bitdepth < 8)) {
    /*if the filter_palette_zero setting is enabled, override the filter strategy with
    zero for all scanlines for palette and less-than-8-bitdepth images*/
    strategy = LFS_ZERO;
  }

  if(bpp == 0) return 31; /*error: invalid color type*/

  if(strategy >= LFS_ZERO && strategy <= LFS_FOUR) {
    unsigned char type = (unsigned char)strategy;
    for(y = 0; y != h; ++y) {
      size_t outindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
      size_t inindex = linebytes * y;
      out[outindex] = type; /*filter type byte*/
      filterScanline(&out[outindex + 1], &in[inindex], prevline, linebytes, bytewidth, type);
      prevline = &in[inindex];
    }
  } else if(strategy == LFS_MINSUM) {
    /*adaptive filtering: independently for each row, try all five filter types and select the one that produces the
    smallest sum of absolute values per row.*/
    unsigned char* attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t smallest = 0;
    unsigned char type, bestType = 0;

    for(type = 0; type != 5; ++type) {
      attempt[type] = (unsigned char*)lodepng_malloc(linebytes);
      if(!attempt[type]) error = 83; /*alloc fail*/
    }

    if(!error) {
      for(y = 0; y != h; ++y) {
        /*try the 5 filter types*/
        for(type = 0; type != 5; ++type) {
          size_t sum = 0;
          filterScanline(attempt[type], &in[y * linebytes], prevline, linebytes, bytewidth, type);

          /*calculate the sum of the result*/
          if(type == 0) {
            for(x = 0; x != linebytes; ++x) sum += (unsigned char)(attempt[type][x]);
          } else {
            for(x = 0; x != linebytes; ++x) {
              /*For differences, each byte should be treated as signed, values above 127 are negative
              (converted to signed char). Filtertype 0 isn't a difference though, so use unsigned there.
              This means filtertype 0 is almost never chosen, but that is justified.*/
              unsigned char s = attempt[type][x];
              sum += s < 128 ? s : (255U - s);
            }
          }

          /*check if this is smallest sum (or if type == 0 it's the first case so always store the values)*/
          if(type == 0 || sum < smallest) {
            bestType = type;
            smallest = sum;
          }
        }

        prevline = &in[y * linebytes];

        /*now fill the out values*/
        out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
        for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType][x];
      }
    }

    for(type = 0; type != 5; ++type) lodepng_free(attempt[type]);
  } else if(strategy == LFS_ENTROPY) {
    unsigned char* attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t bestSum = 0;
    unsigned type, bestType = 0;
    unsigned count[256];

    for(type = 0; type != 5; ++type) {
      attempt[type] = (unsigned char*)lodepng_malloc(linebytes);
      if(!attempt[type]) error = 83; /*alloc fail*/
    }

    if(!error) {
      for(y = 0; y != h; ++y) {
        /*try the 5 filter types*/
        for(type = 0; type != 5; ++type) {
          size_t sum = 0;
          filterScanline(attempt[type], &in[y * linebytes], prevline, linebytes, bytewidth, type);
          lodepng_memset(count, 0, 256 * sizeof(*count));
          for(x = 0; x != linebytes; ++x) ++count[attempt[type][x]];
          ++count[type]; /*the filter type itself is part of the scanline*/
          for(x = 0; x != 256; ++x) {
            sum += ilog2i(count[x]);
          }
          /*check if this is smallest sum (or if type == 0 it's the first case so always store the values)*/
          if(type == 0 || sum > bestSum) {
            bestType = type;
            bestSum = sum;
          }
        }

        prevline = &in[y * linebytes];

        /*now fill the out values*/
        out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
        for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType][x];
      }
    }

    for(type = 0; type != 5; ++type) lodepng_free(attempt[type]);
  } else if(strategy == LFS_PREDEFINED) {
    for(y = 0; y != h; ++y) {
      size_t outindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
      size_t inindex = linebytes * y;
      unsigned char type = settings->predefined_filters[y];
      out[outindex] = type; /*filter type byte*/
      filterScanline(&out[outindex + 1], &in[inindex], prevline, linebytes, bytewidth, type);
      prevline = &in[inindex];
    }
  } else if(strategy == LFS_BRUTE_FORCE) {
    /*brute force filter chooser.
    deflate the scanline after every filter attempt to see which one deflates best.
    This is very slow and gives only slightly smaller, sometimes even larger, result*/
    size_t size[5];
    unsigned char* attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t smallest = 0;
    unsigned type = 0, bestType = 0;
    unsigned char* dummy;
    LodePNGCompressSettings zlibsettings;
    lodepng_memcpy(&zlibsettings, &settings->zlibsettings, sizeof(LodePNGCompressSettings));
    /*use fixed tree on the attempts so that the tree is not adapted to the filtertype on purpose,
    to simulate the true case where the tree is the same for the whole image. Sometimes it gives
    better result with dynamic tree anyway. Using the fixed tree sometimes gives worse, but in rare
    cases better compression. It does make this a bit less slow, so it's worth doing this.*/
    zlibsettings.btype = 1;
    /*a custom encoder likely doesn't read the btype setting and is optimized for complete PNG
    images only, so disable it*/
    zlibsettings.custom_zlib = 0;
    zlibsettings.custom_deflate = 0;
    for(type = 0; type != 5; ++type) {
      attempt[type] = (unsigned char*)lodepng_malloc(linebytes);
      if(!attempt[type]) error = 83; /*alloc fail*/
    }
    if(!error) {
      for(y = 0; y != h; ++y) /*try the 5 filter types*/ {
        for(type = 0; type != 5; ++type) {
          unsigned testsize = (unsigned)linebytes;
          /*if(testsize > 8) testsize /= 8;*/ /*it already works good enough by testing a part of the row*/

          filterScanline(attempt[type], &in[y * linebytes], prevline, linebytes, bytewidth, type);
          size[type] = 0;
          dummy = 0;
          zlib_compress(&dummy, &size[type], attempt[type], testsize, &zlibsettings);
          lodepng_free(dummy);
          /*check if this is smallest size (or if type == 0 it's the first case so always store the values)*/
          if(type == 0 || size[type] < smallest) {
            bestType = type;
            smallest = size[type];
          }
        }
        prevline = &in[y * linebytes];
        out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
        for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType][x];
      }
    }
    for(type = 0; type != 5; ++type) lodepng_free(attempt[type]);
  }
  else return 88; /* unknown filter strategy */

  return error;
}